

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Test.cpp
# Opt level: O0

void setupSourceManager(SourceManager *sourceManager)

{
  StringRef capturedExpression;
  StringRef capturedExpression_00;
  StringRef capturedExpression_01;
  StringRef macroName;
  StringRef macroName_00;
  StringRef macroName_01;
  AssertionHandler *this;
  char *in_RDI;
  error_code eVar1;
  AssertionHandler catchAssertionHandler_2;
  AssertionHandler catchAssertionHandler_1;
  AssertionHandler catchAssertionHandler;
  string testDir;
  undefined4 in_stack_fffffffffffffd48;
  undefined4 uVar2;
  undefined4 in_stack_fffffffffffffd4c;
  AssertionHandler *in_stack_fffffffffffffd50;
  undefined7 in_stack_fffffffffffffd58;
  undefined1 in_stack_fffffffffffffd5f;
  AssertionHandler *in_stack_fffffffffffffd60;
  undefined4 in_stack_fffffffffffffd68;
  undefined4 in_stack_fffffffffffffd6c;
  size_type in_stack_fffffffffffffd70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  Flags in_stack_fffffffffffffd80;
  error_code local_200;
  undefined1 local_1e9;
  StringRef local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  SourceManager *in_stack_fffffffffffffe60;
  string_view in_stack_fffffffffffffe68;
  error_code local_160;
  undefined1 local_149;
  StringRef local_148;
  SourceLineInfo local_138;
  StringRef local_128;
  __sv_type local_d0;
  error_code local_c0;
  undefined1 local_ad;
  StringRef local_a0;
  SourceLineInfo local_90;
  StringRef local_80;
  char *local_8;
  
  local_8 = in_RDI;
  findTestDir_abi_cxx11_();
  local_80 = operator____catch_sr
                       ((char *)in_stack_fffffffffffffd50,
                        CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
  Catch::SourceLineInfo::SourceLineInfo
            (&local_90,
             "/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/tests/unittests/Test.cpp"
             ,0x1f);
  local_a0 = operator____catch_sr
                       ((char *)in_stack_fffffffffffffd50,
                        CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
  uVar2 = 2;
  macroName.m_start._4_4_ = in_stack_fffffffffffffd6c;
  macroName.m_start._0_4_ = in_stack_fffffffffffffd68;
  macroName.m_size = in_stack_fffffffffffffd70;
  capturedExpression.m_start._7_1_ = in_stack_fffffffffffffd5f;
  capturedExpression.m_start._0_7_ = in_stack_fffffffffffffd58;
  capturedExpression.m_size = (size_type)in_stack_fffffffffffffd60;
  Catch::AssertionHandler::AssertionHandler
            (in_stack_fffffffffffffd50,macroName,
             (SourceLineInfo *)CONCAT44(in_stack_fffffffffffffd4c,2),capturedExpression,
             in_stack_fffffffffffffd80);
  local_d0 = std::__cxx11::string::operator_cast_to_basic_string_view
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        in_stack_fffffffffffffd50);
  eVar1 = slang::SourceManager::addUserDirectories
                    (in_stack_fffffffffffffe60,in_stack_fffffffffffffe68);
  local_c0._M_cat = eVar1._M_cat;
  local_c0._M_value = eVar1._M_value;
  std::error_code::operator_cast_to_bool(&local_c0);
  local_ad = Catch::operator<=<bool,_0>
                       ((Decomposer *)CONCAT44(in_stack_fffffffffffffd4c,uVar2),false);
  Catch::AssertionHandler::handleExpr<bool>
            (in_stack_fffffffffffffd60,
             (ExprLhs<bool> *)CONCAT17(in_stack_fffffffffffffd5f,in_stack_fffffffffffffd58));
  Catch::AssertionHandler::complete(in_stack_fffffffffffffd50);
  Catch::AssertionHandler::~AssertionHandler(in_stack_fffffffffffffd50);
  local_128 = operator____catch_sr
                        ((char *)in_stack_fffffffffffffd50,CONCAT44(in_stack_fffffffffffffd4c,uVar2)
                        );
  Catch::SourceLineInfo::SourceLineInfo
            (&local_138,
             "/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/tests/unittests/Test.cpp"
             ,0x20);
  local_148 = operator____catch_sr
                        ((char *)in_stack_fffffffffffffd50,CONCAT44(in_stack_fffffffffffffd4c,uVar2)
                        );
  uVar2 = 2;
  macroName_00.m_start._4_4_ = in_stack_fffffffffffffd6c;
  macroName_00.m_start._0_4_ = in_stack_fffffffffffffd68;
  macroName_00.m_size = in_stack_fffffffffffffd70;
  capturedExpression_00.m_start._7_1_ = in_stack_fffffffffffffd5f;
  capturedExpression_00.m_start._0_7_ = in_stack_fffffffffffffd58;
  capturedExpression_00.m_size = (size_type)in_stack_fffffffffffffd60;
  Catch::AssertionHandler::AssertionHandler
            (in_stack_fffffffffffffd50,macroName_00,
             (SourceLineInfo *)CONCAT44(in_stack_fffffffffffffd4c,2),capturedExpression_00,
             in_stack_fffffffffffffd80);
  std::__cxx11::string::operator_cast_to_basic_string_view
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd50);
  eVar1 = slang::SourceManager::addSystemDirectories
                    (in_stack_fffffffffffffe60,in_stack_fffffffffffffe68);
  local_160._M_cat = eVar1._M_cat;
  local_160._M_value = eVar1._M_value;
  std::error_code::operator_cast_to_bool(&local_160);
  local_149 = Catch::operator<=<bool,_0>
                        ((Decomposer *)CONCAT44(in_stack_fffffffffffffd4c,uVar2),false);
  Catch::AssertionHandler::handleExpr<bool>
            (in_stack_fffffffffffffd60,
             (ExprLhs<bool> *)CONCAT17(in_stack_fffffffffffffd5f,in_stack_fffffffffffffd58));
  Catch::AssertionHandler::complete(in_stack_fffffffffffffd50);
  Catch::AssertionHandler::~AssertionHandler(in_stack_fffffffffffffd50);
  local_1d8.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )operator____catch_sr
                   ((char *)in_stack_fffffffffffffd50,CONCAT44(in_stack_fffffffffffffd4c,uVar2));
  __lhs = &local_1d8;
  Catch::SourceLineInfo::SourceLineInfo
            ((SourceLineInfo *)__lhs,
             "/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/tests/unittests/Test.cpp"
             ,0x21);
  local_1e8 = operator____catch_sr
                        ((char *)in_stack_fffffffffffffd50,CONCAT44(in_stack_fffffffffffffd4c,uVar2)
                        );
  uVar2 = 2;
  macroName_01.m_start._4_4_ = in_stack_fffffffffffffd6c;
  macroName_01.m_start._0_4_ = in_stack_fffffffffffffd68;
  macroName_01.m_size = in_stack_fffffffffffffd70;
  capturedExpression_01.m_start._7_1_ = in_stack_fffffffffffffd5f;
  capturedExpression_01.m_start._0_7_ = in_stack_fffffffffffffd58;
  capturedExpression_01.m_size = (size_type)in_stack_fffffffffffffd60;
  Catch::AssertionHandler::AssertionHandler
            (in_stack_fffffffffffffd50,macroName_01,
             (SourceLineInfo *)CONCAT44(in_stack_fffffffffffffd4c,2),capturedExpression_01,
             in_stack_fffffffffffffd80);
  std::operator+(__lhs,local_8);
  std::__cxx11::string::operator_cast_to_basic_string_view
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd50);
  eVar1 = slang::SourceManager::addSystemDirectories
                    (in_stack_fffffffffffffe60,in_stack_fffffffffffffe68);
  this = (AssertionHandler *)eVar1._M_cat;
  local_200._M_value = eVar1._M_value;
  local_200._M_cat = (error_category *)this;
  std::error_code::operator_cast_to_bool(&local_200);
  local_1e9 = Catch::operator<=<bool,_0>
                        ((Decomposer *)CONCAT44(in_stack_fffffffffffffd4c,uVar2),false);
  Catch::AssertionHandler::handleExpr<bool>
            (this,(ExprLhs<bool> *)CONCAT17(local_1e9,in_stack_fffffffffffffd58));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd50);
  Catch::AssertionHandler::complete(in_stack_fffffffffffffd50);
  Catch::AssertionHandler::~AssertionHandler(in_stack_fffffffffffffd50);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd50);
  return;
}

Assistant:

void setupSourceManager(SourceManager& sourceManager) {
    auto testDir = findTestDir();
    CHECK(!sourceManager.addUserDirectories(testDir));
    CHECK(!sourceManager.addSystemDirectories(testDir));
    CHECK(!sourceManager.addSystemDirectories(testDir + "system/"));
}